

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O3

ValuedAction despot::POMCP::OptimalAction(VNode *vnode)

{
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *pvVar1;
  pointer ppQVar2;
  ulong uVar3;
  double dVar4;
  ValuedAction VVar5;
  ValuedAction astar;
  ValuedAction local_38;
  ValuedAction local_28;
  
  pvVar1 = VNode::children(vnode);
  ValuedAction::ValuedAction(&local_38,-1,-INFINITY);
  ppQVar2 = (pvVar1->super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((pvVar1->super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppQVar2) {
    uVar3 = 0;
    do {
      dVar4 = QNode::value(ppQVar2[uVar3]);
      if (local_38.value < dVar4) {
        dVar4 = QNode::value((pvVar1->
                             super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>).
                             _M_impl.super__Vector_impl_data._M_start[uVar3]);
        ValuedAction::ValuedAction(&local_28,(ACT_TYPE)uVar3,dVar4);
        local_38.action = local_28.action;
        local_38._4_4_ = local_28._4_4_;
        local_38.value = local_28.value;
      }
      uVar3 = uVar3 + 1;
      ppQVar2 = (pvVar1->super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(pvVar1->
                                   super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppQVar2 >> 3)
            );
  }
  VVar5._0_8_ = local_38._0_8_ & 0xffffffff;
  VVar5.value = local_38.value;
  return VVar5;
}

Assistant:

ValuedAction POMCP::OptimalAction(const VNode* vnode) {
	const vector<QNode*>& qnodes = vnode->children();
	ValuedAction astar(-1, Globals::NEG_INFTY);
	for (ACT_TYPE action = 0; action < qnodes.size(); action++) {
		// cout << action << " " << qnodes[action]->value() << " " << qnodes[action]->count() << " " << vnode->count() << endl;
		if (qnodes[action]->value() > astar.value) {
			astar = ValuedAction(action, qnodes[action]->value());
		}
	}
	// assert(atar.action != -1);
	return astar;
}